

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::update_slot_(compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *this,uint64_t slot_id,uint64_t quo,uint64_t dsp,uint64_t node_id)

{
  ulong in_RCX;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  uint64_t _dsp;
  uint64_t v;
  uint64_t in_stack_000000a8;
  uint64_t in_stack_000000b0;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_000000b8;
  
  if (0xe < in_RCX) {
    if (in_RCX - 0xf < 0x7f) {
      compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set
                (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    }
    else {
      standard_hash_table<80U,_poplar::hash::vigna_hasher>::set
                ((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)dsp,node_id,v);
    }
  }
  compact_vector::set((compact_vector *)_dsp,in_stack_00000008,unaff_retaddr);
  compact_vector::set((compact_vector *)_dsp,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void update_slot_(uint64_t slot_id, uint64_t quo, uint64_t dsp, uint64_t node_id) {
        assert(table_[slot_id] == 0);
        assert(quo < symb_size_.size());

        uint64_t v = quo << dsp1_bits;

        if (dsp < dsp1_mask) {
            v |= dsp;
        } else {
            v |= dsp1_mask;
            uint64_t _dsp = dsp - dsp1_mask;
            if (_dsp < dsp2_mask) {
                aux_cht_.set(slot_id, _dsp);
            } else {
                aux_map_.set(slot_id, dsp);
            }
        }

#ifdef POPLAR_EXTRA_STATS
        if (dsp < dsp1_mask) {
            ++num_dsps_[0];
        } else if (dsp < dsp1_mask + dsp2_mask) {
            ++num_dsps_[1];
        } else {
            ++num_dsps_[2];
        }
#endif

        table_.set(slot_id, v);
        ids_.set(slot_id, node_id);
    }